

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPostsolveStack.h
# Opt level: O0

void __thiscall
presolve::HighsPostsolveStack::equalityRowAdditions<HighsTripletPositionSlice>
          (HighsPostsolveStack *this,HighsInt addedEqRow,
          HighsMatrixSlice<HighsTripletPositionSlice> *eqRowVec,
          vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
          *targetRows)

{
  bool bVar1;
  reference this_00;
  char *pcVar2;
  reference pvVar3;
  int __c;
  undefined8 in_RDX;
  int in_ESI;
  iterator *rhs;
  vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
  *in_RDI;
  HighsSliceNonzero *rowVal;
  iterator __end0;
  iterator __begin0;
  HighsMatrixSlice<HighsTripletPositionSlice> *__range2;
  HighsMatrixSlice<HighsTripletPositionSlice> *in_stack_ffffffffffffff60;
  vector<int,_std::allocator<int>_> *this_01;
  vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
  *in_stack_ffffffffffffff68;
  ReductionType type;
  HighsPostsolveStack *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff80;
  value_type vVar4;
  iterator local_68;
  iterator local_48;
  undefined8 local_28;
  undefined8 local_18;
  int local_c;
  
  local_18 = in_RDX;
  local_c = in_ESI;
  std::
  vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
  ::clear((vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
           *)0x72932f);
  local_28 = local_18;
  HighsMatrixSlice<HighsTripletPositionSlice>::begin(in_stack_ffffffffffffff60);
  HighsMatrixSlice<HighsTripletPositionSlice>::end(in_stack_ffffffffffffff60);
  while( true ) {
    rhs = &local_68;
    bVar1 = HighsMatrixSlice<HighsTripletPositionSlice>::iterator::operator!=(&local_48,rhs);
    if (!bVar1) break;
    this_00 = HighsMatrixSlice<HighsTripletPositionSlice>::iterator::operator*(&local_48);
    in_stack_ffffffffffffff68 = in_RDI + 7;
    this_01 = (vector<int,_std::allocator<int>_> *)(in_RDI + 4);
    pcVar2 = HighsSliceNonzero::index(this_00,(char *)rhs,__c);
    in_stack_ffffffffffffff70 =
         (HighsPostsolveStack *)
         std::vector<int,_std::allocator<int>_>::operator[](this_01,(long)(int)pcVar2);
    HighsSliceNonzero::value(this_00);
    std::
    vector<presolve::HighsPostsolveStack::Nonzero,std::allocator<presolve::HighsPostsolveStack::Nonzero>>
    ::emplace_back<int&,double>
              ((vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
                *)in_stack_ffffffffffffff70,(int *)in_stack_ffffffffffffff68,(double *)this_01);
    HighsMatrixSlice<HighsTripletPositionSlice>::iterator::operator++(&local_48);
  }
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 5),(long)local_c);
  vVar4 = *pvVar3;
  HighsDataStack::push<presolve::HighsPostsolveStack::EqualityRowAdditions,_0>
            ((HighsDataStack *)in_stack_ffffffffffffff70,
             (EqualityRowAdditions *)in_stack_ffffffffffffff68);
  type = (ReductionType)((ulong)in_stack_ffffffffffffff68 >> 0x38);
  HighsDataStack::push<presolve::HighsPostsolveStack::Nonzero>
            ((HighsDataStack *)CONCAT44(vVar4,in_stack_ffffffffffffff80),in_RDI);
  HighsDataStack::push<presolve::HighsPostsolveStack::Nonzero>
            ((HighsDataStack *)CONCAT44(vVar4,in_stack_ffffffffffffff80),in_RDI);
  reductionAdded(in_stack_ffffffffffffff70,type);
  return;
}

Assistant:

void equalityRowAdditions(HighsInt addedEqRow,
                            const HighsMatrixSlice<RowStorageFormat>& eqRowVec,
                            const std::vector<Nonzero>& targetRows) {
    rowValues.clear();
    for (const HighsSliceNonzero& rowVal : eqRowVec)
      rowValues.emplace_back(origColIndex[rowVal.index()], rowVal.value());

    reductionValues.push(EqualityRowAdditions{origRowIndex[addedEqRow]});
    reductionValues.push(rowValues);
    reductionValues.push(targetRows);
    reductionAdded(ReductionType::kEqualityRowAdditions);
  }